

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

int __thiscall asl::Array<asl::Xml>::remove(Array<asl::Xml> *this,char *__filename)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  
  iVar1 = *(int *)&this->_a[-2].super_NodeBase._p;
  iVar2 = (int)__filename;
  if (in_EDX + iVar2 <= iVar1) {
    asl_destroy<asl::Xml>(this->_a + iVar2,in_EDX);
    memmove(this->_a + iVar2,this->_a + iVar2 + in_EDX,(long)(iVar1 - (in_EDX + iVar2)) << 3);
    *(int *)&this->_a[-2].super_NodeBase._p = *(int *)&this->_a[-2].super_NodeBase._p - in_EDX;
    resize(this,iVar1 - in_EDX);
  }
  return (int)this;
}

Assistant:

Array& remove(int i, int n = 1)
	{
		int m = d().n;
		if (i + n > m)
			return *this;
		asl_destroy(_a+i, n);
		memmove((char*)(_a + i), _a + i + n, (m - i - n)*sizeof(T));
		d().n -= n;
		resize(m - n);
		return *this;
	}